

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

void __thiscall QHttpMultiPartPrivate::QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  QHttpMultiPartIODevice *this_00;
  QRandomGenerator *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_c0;
  QArrayDataPointer<char> local_a8;
  QStringBuilder<const_char_(&)[16],_QByteArray> local_88;
  QArrayDataPointer<char> local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QHttpMultiPartPrivate_002cd290;
  (this->parts).d.d = (Data *)0x0;
  (this->parts).d.ptr = (QHttpPart *)0x0;
  (this->parts).d.size = 0;
  (this->boundary).d.d = (Data *)0x0;
  (this->boundary).d.ptr = (char *)0x0;
  (this->boundary).d.size = 0;
  this->contentType = MixedType;
  this_00 = (QHttpMultiPartIODevice *)operator_new(0x40);
  QHttpMultiPartIODevice::QHttpMultiPartIODevice(this_00,this);
  this->device = this_00;
  this_01 = (QRandomGenerator *)QRandomGenerator64::global();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QRandomGenerator::fillRange<unsigned_int,_6UL,_true>(this_01,(uint (*) [6])&local_48);
  QByteArray::fromRawData((QByteArray *)&local_c0,(char *)&local_48,0x18);
  QByteArray::toBase64(&local_a8,&local_c0,0);
  local_88.b.d.size = local_a8.size;
  local_88.b.d.ptr = local_a8.ptr;
  local_88.b.d.d = local_a8.d;
  local_88.a = (char (*) [16])0x24d030;
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (char *)0x0;
  local_a8.size = 0;
  QStringBuilder<const_char_(&)[16],_QByteArray>::convertTo<QByteArray>
            ((QByteArray *)&local_68,&local_88);
  pDVar2 = (this->boundary).d.d;
  pcVar3 = (this->boundary).d.ptr;
  (this->boundary).d.d = local_68.d;
  (this->boundary).d.ptr = local_68.ptr;
  qVar1 = (this->boundary).d.size;
  (this->boundary).d.size = local_68.size;
  local_68.d = pDVar2;
  local_68.ptr = pcVar3;
  local_68.size = qVar1;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpMultiPartPrivate::QHttpMultiPartPrivate() : contentType(QHttpMultiPart::MixedType), device(new QHttpMultiPartIODevice(this))
{
    // 24 random bytes, becomes 32 characters when encoded to Base64
    quint32 random[6];
    QRandomGenerator::global()->fillRange(random);
    boundary = "boundary_.oOo._"
               + QByteArray::fromRawData(reinterpret_cast<char *>(random), sizeof(random)).toBase64();

    // boundary must not be longer than 70 characters, see RFC 2046, section 5.1.1
    Q_ASSERT(boundary.size() <= 70);
}